

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void mark_list(zt_gc_t *gc,value_t *value)

{
  zt_elist *pzVar1;
  value_t *pdata;
  
  pzVar1 = value[1].mark.list.next;
  pdata = value;
  if (pzVar1 != (zt_elist *)0x0) {
    mark_value(gc,value,pzVar1);
  }
  pzVar1 = value[1].mark.list.prev;
  if (pzVar1 != (zt_elist *)0x0) {
    mark_value(gc,pdata,pzVar1);
    return;
  }
  return;
}

Assistant:

static void
mark_list(zt_gc_t * gc, value_t * value) {
    list_t  * list = (list_t *)value;

    /*  we want to mark any child "objects" that are managed
     *  by the GC
     */
    if (list->value) {
        mark_value(gc, NULL, list->value);
    }

    if (list->tail) {
        mark_value(gc, NULL, list->tail);
    }
}